

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::FileDescriptorSet::FileDescriptorSet(FileDescriptorSet *this,Arena *arena)

{
  Arena *in_RSI;
  FileDescriptorSet *in_RDI;
  Arena *in_stack_ffffffffffffffb8;
  
  Message::Message(&in_RDI->super_Message);
  ((RepeatedPtrFieldBase *)&in_RDI->super_Message)->arena_ =
       (Arena *)&PTR__FileDescriptorSet_008d82c0;
  internal::InternalMetadataWithArena::InternalMetadataWithArena
            ((InternalMetadataWithArena *)in_RDI,in_stack_ffffffffffffffb8);
  memset(&in_RDI->_has_bits_,0,4);
  internal::CachedSize::CachedSize((CachedSize *)0x4ebcb8);
  RepeatedPtrField<google::protobuf::FileDescriptorProto>::RepeatedPtrField
            ((RepeatedPtrField<google::protobuf::FileDescriptorProto> *)in_RDI,
             (Arena *)&in_RDI->file_);
  SharedCtor((FileDescriptorSet *)0x4ebcdb);
  RegisterArenaDtor(in_RDI,in_RSI);
  return;
}

Assistant:

FileDescriptorSet::FileDescriptorSet(::PROTOBUF_NAMESPACE_ID::Arena* arena)
  : ::PROTOBUF_NAMESPACE_ID::Message(),
  _internal_metadata_(arena),
  file_(arena) {
  SharedCtor();
  RegisterArenaDtor(arena);
  // @@protoc_insertion_point(arena_constructor:google.protobuf.FileDescriptorSet)
}